

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O3

int wally_s2c_commitment_verify
              (uchar *sig,size_t sig_len,uchar *s2c_data,size_t s2c_data_len,uchar *s2c_opening,
              size_t s2c_opening_len,uint32_t flags)

{
  int iVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_ecdsa_s2c_opening local_b0;
  secp256k1_ecdsa_signature local_70;
  
  ctx = secp_ctx();
  iVar2 = -2;
  if (flags == 1 &&
      ((s2c_opening_len == 0x21 && s2c_opening != (uchar *)0x0) &&
      ((s2c_data_len == 0x20 && sig_len == 0x40) &&
      (s2c_data != (uchar *)0x0 && sig != (uchar *)0x0)))) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar2 = -3;
    }
    else {
      iVar1 = secp256k1_ecdsa_signature_parse_compact(ctx,&local_70,sig);
      iVar2 = -2;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_s2c_opening_parse(ctx,&local_b0,s2c_opening);
        if (iVar1 != 0) {
          iVar2 = secp256k1_ecdsa_s2c_verify_commit(ctx,&local_70,s2c_data,&local_b0);
          iVar2 = (uint)(iVar2 != 0) * 2 + -2;
        }
      }
      wally_clear_2(&local_70,0x40,&local_b0,0x40);
    }
  }
  return iVar2;
}

Assistant:

int wally_s2c_commitment_verify(const unsigned char *sig, size_t sig_len,
                                const unsigned char *s2c_data, size_t s2c_data_len,
                                const unsigned char *s2c_opening, size_t s2c_opening_len,
                                uint32_t flags)
{
    secp256k1_ecdsa_signature sig_secp;
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!sig || sig_len != EC_SIGNATURE_LEN ||
        !s2c_data || s2c_data_len != WALLY_S2C_DATA_LEN ||
        !s2c_opening || s2c_opening_len != WALLY_S2C_OPENING_LEN ||
        flags != EC_FLAG_ECDSA)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
         secp256k1_ecdsa_s2c_opening_parse(ctx, &opening_secp, s2c_opening) &&
         secp256k1_ecdsa_s2c_verify_commit(ctx, &sig_secp, s2c_data, &opening_secp);

    wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}